

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::SemanticAnalyser(SemanticAnalyser *this)

{
  Visitor *in_RDI;
  SemanticAnalyser *in_stack_000000a0;
  
  Visitor::Visitor(in_RDI);
  in_RDI->_vptr_Visitor = (_func_int **)&PTR__SemanticAnalyser_002b10d0;
  SymbolTable::SymbolTable((SymbolTable *)this);
  std::
  stack<SemanticAnalyser::ReturnInfo,std::deque<SemanticAnalyser::ReturnInfo,std::allocator<SemanticAnalyser::ReturnInfo>>>
  ::
  stack<std::deque<SemanticAnalyser::ReturnInfo,std::allocator<SemanticAnalyser::ReturnInfo>>,void>
            ((stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
              *)(in_RDI + 0xb));
  addBuildInSymbols(in_stack_000000a0);
  return;
}

Assistant:

SemanticAnalyser::SemanticAnalyser(): symbols_(), hasReturn_()
{
  addBuildInSymbols();
}